

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_add_asn1_int64_with_tag(CBB *cbb,int64_t value,CBS_ASN1_TAG tag)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  anon_union_32_2_4f6aaa2e_for_u *paVar5;
  long lVar6;
  long lVar7;
  uint8_t bytes [8];
  CBB child;
  byte bStack_51;
  int64_t local_50;
  CBB local_48;
  
  if (-1 < value) {
    iVar2 = CBB_add_asn1_uint64_with_tag(cbb,value,tag);
    return iVar2;
  }
  local_50 = value;
  uVar4 = 7;
  do {
    uVar3 = uVar4;
    if (((int)uVar3 == 0) || (*(char *)((long)&local_50 + uVar3) != -1)) break;
    uVar4 = (ulong)((int)uVar3 - 1);
  } while (*(char *)((long)&local_50 + uVar4) < '\0');
  iVar2 = CBB_add_asn1(cbb,&local_48,tag);
  if (iVar2 == 0) {
LAB_00167492:
    paVar5 = &cbb->u;
    if (cbb->is_child != '\0') {
      paVar5 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar5->base).buf;
    }
    *(byte *)((long)paVar5 + 0x18) = *(byte *)((long)paVar5 + 0x18) | 2;
    cbb->child = (CBB *)0x0;
    iVar2 = 0;
  }
  else {
    lVar6 = uVar3 + 1;
    do {
      iVar2 = cbb_add_u(&local_48,(ulong)(&bStack_51)[lVar6],1);
      if (iVar2 == 0) goto LAB_00167492;
      lVar7 = lVar6 + -1;
      bVar1 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar1);
    iVar2 = CBB_flush(cbb);
  }
  return iVar2;
}

Assistant:

int CBB_add_asn1_int64_with_tag(CBB *cbb, int64_t value, CBS_ASN1_TAG tag) {
  if (value >= 0) {
    return CBB_add_asn1_uint64_with_tag(cbb, (uint64_t)value, tag);
  }

  uint8_t bytes[sizeof(int64_t)];
  memcpy(bytes, &value, sizeof(value));
  int start = 7;
  // Skip leading sign-extension bytes unless they are necessary.
  while (start > 0 && (bytes[start] == 0xff && (bytes[start - 1] & 0x80))) {
    start--;
  }

  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }
  for (int i = start; i >= 0; i--) {
    if (!CBB_add_u8(&child, bytes[i])) {
      goto err;
    }
  }
  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}